

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS ref_layer_normal(REF_LAYER ref_layer,REF_GRID ref_grid,REF_INT node,REF_DBL *norm)

{
  REF_CELL ref_cell_00;
  uint uVar1;
  double local_158;
  double local_148;
  double local_140;
  double local_130;
  double local_128;
  double local_118;
  REF_INT local_10c;
  REF_INT local_108;
  int local_104;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL triangle_norm [3];
  REF_DBL total;
  REF_DBL angle;
  REF_INT local_b8;
  REF_BOOL contains;
  REF_INT nodes [27];
  REF_INT local_44;
  int local_40;
  REF_INT cell;
  REF_INT item;
  REF_INT i;
  REF_CELL ref_cell;
  REF_DBL *norm_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  REF_LAYER ref_layer_local;
  
  ref_cell_00 = ref_grid->cell[3];
  triangle_norm[2] = 0.0;
  *norm = 0.0;
  norm[1] = 0.0;
  norm[2] = 0.0;
  if ((node < 0) || (ref_cell_00->ref_adj->nnode <= node)) {
    local_104 = -1;
  }
  else {
    local_104 = ref_cell_00->ref_adj->first[node];
  }
  local_40 = local_104;
  if (local_104 == -1) {
    local_108 = -1;
  }
  else {
    local_108 = ref_cell_00->ref_adj->item[local_104].ref;
  }
  local_44 = local_108;
  do {
    if (local_40 == -1) {
      if (triangle_norm[2] * 1e+20 <= 0.0) {
        local_118 = -(triangle_norm[2] * 1e+20);
      }
      else {
        local_118 = triangle_norm[2] * 1e+20;
      }
      if (*norm <= 0.0) {
        local_128 = -*norm;
      }
      else {
        local_128 = *norm;
      }
      if (local_128 < local_118) {
        if (triangle_norm[2] * 1e+20 <= 0.0) {
          local_130 = -(triangle_norm[2] * 1e+20);
        }
        else {
          local_130 = triangle_norm[2] * 1e+20;
        }
        if (norm[1] <= 0.0) {
          local_140 = -norm[1];
        }
        else {
          local_140 = norm[1];
        }
        if (local_140 < local_130) {
          if (triangle_norm[2] * 1e+20 <= 0.0) {
            local_148 = -(triangle_norm[2] * 1e+20);
          }
          else {
            local_148 = triangle_norm[2] * 1e+20;
          }
          if (norm[2] <= 0.0) {
            local_158 = -norm[2];
          }
          else {
            local_158 = norm[2];
          }
          if (local_158 < local_148) {
            for (cell = 0; cell < 3; cell = cell + 1) {
              norm[cell] = norm[cell] / triangle_norm[2];
            }
            uVar1 = ref_math_normalize(norm);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x71,"ref_layer_normal",(ulong)uVar1,"normalize average norm");
              return uVar1;
            }
            return 0;
          }
        }
      }
      return 4;
    }
    uVar1 = ref_list_contains(ref_layer->ref_list,local_44,(REF_BOOL *)((long)&angle + 4));
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x5e,
             "ref_layer_normal",(ulong)uVar1,"in layer");
      return uVar1;
    }
    if (angle._4_4_ != 0) {
      uVar1 = ref_cell_nodes(ref_cell_00,local_44,&local_b8);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x60,"ref_layer_normal",(ulong)uVar1,"tri nodes");
        return uVar1;
      }
      uVar1 = ref_node_tri_node_angle(ref_grid->node,&local_b8,node,&total);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x62,"ref_layer_normal",(ulong)uVar1,"angle");
        return uVar1;
      }
      uVar1 = ref_node_tri_normal(ref_grid->node,&local_b8,(REF_DBL *)&ref_private_macro_code_rss_1)
      ;
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",100
               ,"ref_layer_normal",(ulong)uVar1,"norm");
        return uVar1;
      }
      uVar1 = ref_math_normalize((REF_DBL *)&ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x65,"ref_layer_normal",(ulong)uVar1,"normalize tri norm");
        return uVar1;
      }
      triangle_norm[2] = total + triangle_norm[2];
      for (cell = 0; cell < 3; cell = cell + 1) {
        norm[cell] = total * *(double *)(&ref_private_macro_code_rss_1 + (long)cell * 2) +
                     norm[cell];
      }
    }
    local_40 = ref_cell_00->ref_adj->item[local_40].next;
    if (local_40 == -1) {
      local_10c = -1;
    }
    else {
      local_10c = ref_cell_00->ref_adj->item[local_40].ref;
    }
    local_44 = local_10c;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_layer_normal(REF_LAYER ref_layer,
                                           REF_GRID ref_grid, REF_INT node,
                                           REF_DBL *norm) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT i, item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL contains;
  REF_DBL angle, total, triangle_norm[3];

  total = 0.0;
  norm[0] = 0.0;
  norm[1] = 0.0;
  norm[2] = 0.0;

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_list_contains(ref_layer_list(ref_layer), cell, &contains),
        "in layer");
    if (!contains) continue;
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "tri nodes");
    RSS(ref_node_tri_node_angle(ref_grid_node(ref_grid), nodes, node, &angle),
        "angle");
    RSS(ref_node_tri_normal(ref_grid_node(ref_grid), nodes, triangle_norm),
        "norm");
    RSS(ref_math_normalize(triangle_norm), "normalize tri norm");
    total += angle;
    for (i = 0; i < 3; i++) norm[i] += angle * triangle_norm[i];
  }

  if (!ref_math_divisible(norm[0], total) ||
      !ref_math_divisible(norm[1], total) ||
      !ref_math_divisible(norm[2], total))
    return REF_DIV_ZERO;

  for (i = 0; i < 3; i++) norm[i] /= total;

  RSS(ref_math_normalize(norm), "normalize average norm");

  return REF_SUCCESS;
}